

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O0

int ladspa_segment_start(mixed_segment *segment)

{
  long *plVar1;
  ladspa_segment_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  if ((char)plVar1[2] == '\0') {
    if (*(long *)(*plVar1 + 0x68) != 0) {
      (**(code **)(*plVar1 + 0x68))(plVar1[1]);
    }
    *(undefined1 *)(plVar1 + 2) = 1;
    segment_local._4_4_ = 1;
  }
  else {
    mixed_err(9);
    segment_local._4_4_ = 0;
  }
  return segment_local._4_4_;
}

Assistant:

int ladspa_segment_start(struct mixed_segment *segment){
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  if(data->active){
    mixed_err(MIXED_SEGMENT_ALREADY_STARTED);
    return 0;
  }
  
  if(data->descriptor->activate){
    data->descriptor->activate(data->handle);
  }
  data->active = 1;
  return 1;
}